

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  float *pfVar4;
  uint uVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  
  uVar2 = b->c;
  uVar5 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,(Allocator *)opt);
  iVar7 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pfVar4 = (float *)(b->cstep * uVar3 * b->elemsize + (long)b->data);
        pauVar6 = (undefined1 (*) [32])(c->cstep * uVar3 * c->elemsize + (long)c->data);
        fVar1 = *a->data;
        auVar11._4_4_ = fVar1;
        auVar11._0_4_ = fVar1;
        auVar11._8_4_ = fVar1;
        auVar11._12_4_ = fVar1;
        if ((int)uVar5 < 8) {
          uVar8 = 0;
        }
        else {
          iVar7 = 7;
          do {
            auVar12._0_4_ = fVar1 + *pfVar4;
            auVar12._4_4_ = fVar1 + pfVar4[1];
            auVar12._8_4_ = fVar1 + pfVar4[2];
            auVar12._12_4_ = fVar1 + pfVar4[3];
            auVar12._16_4_ = fVar1 + pfVar4[4];
            auVar12._20_4_ = fVar1 + pfVar4[5];
            auVar12._24_4_ = fVar1 + pfVar4[6];
            auVar12._28_4_ = fVar1 + pfVar4[7];
            *pauVar6 = auVar12;
            pfVar4 = pfVar4 + 8;
            pauVar6 = pauVar6 + 1;
            iVar7 = iVar7 + 8;
            uVar8 = uVar5 & 0xfffffff8;
          } while (iVar7 < (int)uVar5);
        }
        if ((int)(uVar8 | 3) < (int)uVar5) {
          auVar11 = vshufps_avx(auVar11,auVar11,0);
          uVar9 = uVar8;
          do {
            auVar13._0_4_ = auVar11._0_4_ + *pfVar4;
            auVar13._4_4_ = auVar11._4_4_ + pfVar4[1];
            auVar13._8_4_ = auVar11._8_4_ + pfVar4[2];
            auVar13._12_4_ = auVar11._12_4_ + pfVar4[3];
            *(undefined1 (*) [16])*pauVar6 = auVar13;
            pfVar4 = pfVar4 + 4;
            pauVar6 = (undefined1 (*) [32])((long)*pauVar6 + 0x10);
            uVar8 = uVar9 + 4;
            iVar7 = uVar9 + 7;
            uVar9 = uVar8;
          } while (iVar7 < (int)uVar5);
        }
        if (uVar5 - uVar8 != 0 && (int)uVar8 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)((long)*pauVar6 + lVar10 * 4) = fVar1 + pfVar4[lVar10];
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar8 != (int)lVar10);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}